

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::compiler::CodeGeneratorRequest::InternalSerializeWithCachedSizesToArray
          (CodeGeneratorRequest *this,uint8 *target,EpsCopyOutputStream *stream)

{
  uint uVar1;
  int iVar2;
  string *s;
  size_t __n;
  Version *this_00;
  FileDescriptorProto *this_01;
  void *pvVar3;
  uint8 *puVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  uint8 *local_38;
  
  uVar1 = (this->file_to_generate_).super_RepeatedPtrFieldBase.current_size_;
  uVar5 = 0;
  uVar7 = (ulong)uVar1;
  local_38 = target;
  if ((int)uVar1 < 1) {
    uVar7 = uVar5;
  }
  for (; puVar4 = local_38, uVar7 != uVar5; uVar5 = uVar5 + 1) {
    s = (string *)((this->file_to_generate_).super_RepeatedPtrFieldBase.rep_)->elements[uVar5];
    __n = s->_M_string_length;
    if (((long)__n < 0x80) && ((long)__n <= (long)(stream->end_ + (0xe - (long)local_38)))) {
      *local_38 = '\n';
      local_38[1] = (uint8)__n;
      memcpy(local_38 + 2,(s->_M_dataplus)._M_p,__n);
      local_38 = puVar4 + __n + 2;
    }
    else {
      local_38 = io::EpsCopyOutputStream::WriteStringOutline(stream,1,s,local_38);
    }
  }
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    local_38 = io::EpsCopyOutputStream::WriteStringMaybeAliased
                         (stream,2,(this->parameter_).ptr_,local_38);
  }
  if ((uVar1 & 2) != 0) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    this_00 = this->compiler_version_;
    *local_38 = '\x1a';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_00->_cached_size_).size_.super___atomic_base<int>._M_i,local_38 + 1);
    local_38 = Version::InternalSerializeWithCachedSizesToArray(this_00,puVar4,stream);
  }
  iVar2 = (this->proto_file_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar2 != iVar6; iVar6 = iVar6 + 1) {
    io::EpsCopyOutputStream::EnsureSpace(stream,&local_38);
    this_01 = (FileDescriptorProto *)
              ((this->proto_file_).super_RepeatedPtrFieldBase.rep_)->elements[iVar6];
    *local_38 = 'z';
    puVar4 = io::CodedOutputStream::WriteVarint32ToArray
                       ((this_01->_cached_size_).size_.super___atomic_base<int>._M_i,local_38 + 1);
    local_38 = FileDescriptorProto::InternalSerializeWithCachedSizesToArray(this_01,puVar4,stream);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    local_38 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                         ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),local_38,stream);
  }
  return local_38;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* CodeGeneratorRequest::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.compiler.CodeGeneratorRequest)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated string file_to_generate = 1;
  for (int i = 0, n = this->_internal_file_to_generate_size(); i < n; i++) {
    const auto& s = this->_internal_file_to_generate(i);
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      s.data(), static_cast<int>(s.length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.file_to_generate");
    target = stream->WriteString(1, s, target);
  }

  cached_has_bits = _has_bits_[0];
  // optional string parameter = 2;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_parameter().data(), static_cast<int>(this->_internal_parameter().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.compiler.CodeGeneratorRequest.parameter");
    target = stream->WriteStringMaybeAliased(
        2, this->_internal_parameter(), target);
  }

  // optional .google.protobuf.compiler.Version compiler_version = 3;
  if (cached_has_bits & 0x00000002u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(
        3, _Internal::compiler_version(this), target, stream);
  }

  // repeated .google.protobuf.FileDescriptorProto proto_file = 15;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_proto_file_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(15, this->_internal_proto_file(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.compiler.CodeGeneratorRequest)
  return target;
}